

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O0

node_t make_node(size_t refcount_,size_t prefix_length_,size_t edgecount_)

{
  uchar *data_;
  long in_RDX;
  long in_RSI;
  uint32_t in_EDI;
  uchar *data;
  size_t node_size;
  node_t node;
  node_t local_8;
  
  data_ = (uchar *)malloc(in_RSI + 0xc + in_RDX * 9);
  if (data_ == (uchar *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","data",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
            ,0xae);
    fflush(_stderr);
    zmq::zmq_abort((char *)0x30c8a1);
  }
  node_t::node_t(&local_8,data_);
  node_t::set_refcount(&local_8,in_EDI);
  node_t::set_prefix_length(&local_8,(uint32_t)in_RSI);
  node_t::set_edgecount(&local_8,(uint32_t)in_RDX);
  return (node_t)local_8._data;
}

Assistant:

node_t make_node (size_t refcount_, size_t prefix_length_, size_t edgecount_)
{
    const size_t node_size = 3 * sizeof (uint32_t) + prefix_length_
                             + edgecount_ * (1 + sizeof (void *));

    unsigned char *data = static_cast<unsigned char *> (malloc (node_size));
    zmq_assert (data);

    node_t node (data);
    node.set_refcount (static_cast<uint32_t> (refcount_));
    node.set_prefix_length (static_cast<uint32_t> (prefix_length_));
    node.set_edgecount (static_cast<uint32_t> (edgecount_));
    return node;
}